

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O1

int bf_write(bfile_t *bfile,uint8_t *buffer,uint len)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong __n;
  
  if (len == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      uVar1 = (ulong)bfile->buffer_size;
      if (bfile->pos - bfile->ipos < uVar1) {
        uVar2 = bfile->pos % uVar1;
        uVar1 = uVar1 - uVar2;
        __n = len - uVar3;
        if (uVar1 < __n) {
          __n = uVar1;
        }
        memcpy(bfile->buffer + uVar2,buffer + uVar3,__n);
        uVar3 = uVar3 + __n;
        bfile->pos = bfile->pos + __n;
      }
      else {
        bf_write_buffer(bfile);
      }
    } while (uVar3 < len);
  }
  return (int)uVar3;
}

Assistant:

int
bf_write(
    bfile_t * bfile,
    uint8_t * buffer,
    unsigned int len )
{
    size_t haswritten, towrite;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_WRITABLE) != FALSE );

    haswritten = 0;
    towrite = len;
    while ( haswritten < towrite ) {
        if ( (bfile->pos - bfile->ipos) < bfile->buffer_size ) {
            size_t bufoff, cpylen;
            bufoff = bfile->pos % bfile->buffer_size;
            cpylen = PRF_MIN( (bfile->buffer_size - bufoff), (towrite - haswritten) );
            memcpy( bfile->buffer + bufoff, buffer + haswritten, cpylen );
            haswritten += cpylen;
            bfile->pos += cpylen;
        } else {
            bf_write_buffer( bfile );
        }
    }

    return (int)haswritten;
}